

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::addDrawBufferCommonTests
               (TestCaseGroup *root,PrePost prepost)

{
  undefined8 uVar1;
  TestCase *pTVar2;
  BlendState advancedEqStateA;
  BlendState separateEqStateB;
  BlendState enableState;
  BlendState advancedEqStateB;
  BlendState separateEqStateA;
  BlendState disableState;
  BlendState emptyState;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_388;
  undefined1 local_360 [16];
  undefined4 local_350 [2];
  anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
  local_348 [3];
  undefined1 local_2f8 [16];
  undefined4 local_2e8 [2];
  anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
  local_2e0 [3];
  undefined1 local_290 [24];
  anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
  local_278 [3];
  undefined1 local_228 [32];
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
  local_1f0 [3];
  undefined1 local_1a0 [24];
  anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
  local_188 [3];
  BlendState local_138;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> local_d0;
  Maybe<tcu::Vector<bool,_4>_> local_b8;
  Maybe<tcu::Vector<bool,_4>_> local_a8;
  BlendState local_98;
  
  local_1a0._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_290._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_138.enableBlend.m_ptr = (bool *)0x0;
  local_2f8._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  BlendState::BlendState
            (&local_98,(Maybe<bool> *)local_1a0,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_290,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)&local_138,(Maybe<tcu::Vector<bool,_4>_> *)local_2f8);
  local_2f8._0_8_ = local_2f8 + 8;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_1a0._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_290._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_360._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  BlendState::BlendState
            (&local_138,(Maybe<bool> *)local_2f8,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_1a0,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_290,(Maybe<tcu::Vector<bool,_4>_> *)local_360);
  local_360._0_8_ = local_360 + 8;
  local_360[8] = 1;
  local_2f8._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_1a0._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_208._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  BlendState::BlendState
            ((BlendState *)local_290,(Maybe<bool> *)local_360,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_2f8,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_1a0,(Maybe<tcu::Vector<bool,_4>_> *)local_208);
  pTVar2 = createDiffTest(root->m_context,prepost,"common_enable_buffer_enable",
                          (BlendState *)local_290,(BlendState *)local_290);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pTVar2 = createDiffTest(root->m_context,prepost,"common_disable_buffer_disable",&local_138,
                          &local_138);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pTVar2 = createDiffTest(root->m_context,prepost,"common_disable_buffer_enable",&local_138,
                          (BlendState *)local_290);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pTVar2 = createDiffTest(root->m_context,prepost,"common_enable_buffer_disable",
                          (BlendState *)local_290,&local_138);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  BlendState::~BlendState((BlendState *)local_290);
  BlendState::~BlendState(&local_138);
  local_360._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_2f8._8_8_ = local_2e8;
  local_2f8[0] = 1;
  local_2e8[0] = 0x8006;
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe((Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
           *)local_1a0,
          (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
          local_2f8);
  local_290._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_208._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  BlendState::BlendState
            (&local_138,(Maybe<bool> *)local_360,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_1a0,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_290,(Maybe<tcu::Vector<bool,_4>_> *)local_208);
  if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)local_1a0._0_8_ !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    *(bool *)local_1a0._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
      *)(local_1a0._0_8_ + 8))->m_first = (BlendFunc *)0x0;
  }
  local_208._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_360._8_8_ = local_350;
  local_360[0] = 1;
  local_350[0] = 0x800a;
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe((Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
           *)local_2f8,
          (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
          local_360);
  local_1a0._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_388.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  BlendState::BlendState
            ((BlendState *)local_290,(Maybe<bool> *)local_208,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_2f8,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_1a0,(Maybe<tcu::Vector<bool,_4>_> *)&local_388);
  if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)local_2f8._0_8_ !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    *(bool *)local_2f8._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
      *)(local_2f8._0_8_ + 8))->m_first = (BlendFunc *)0x0;
  }
  local_388.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_208._8_8_ = local_1f8;
  local_208._0_8_ = local_208._0_8_ & 0xffffffffffffff00;
  local_1f8 = (undefined1  [8])0x800a00008006;
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe((Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
           *)local_360,
          (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
          local_208);
  local_2f8._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_228._0_8_ =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0
  ;
  BlendState::BlendState
            ((BlendState *)local_1a0,(Maybe<bool> *)&local_388,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_360,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_2f8,(Maybe<tcu::Vector<bool,_4>_> *)local_228);
  if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)local_360._0_8_ !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    *(bool *)local_360._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
      *)(local_360._0_8_ + 8))->m_first = (BlendFunc *)0x0;
  }
  local_228._0_8_ =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0
  ;
  local_388.field_1.m_align = (long)&local_388.field_1 + 8;
  local_388.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)((ulong)local_388.m_ptr & 0xffffffffffffff00);
  local_388.field_1._8_8_ = 0x80060000800a;
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe((Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
           *)local_208,
          (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
          &local_388);
  local_360._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_d0.m_isFirst = false;
  local_d0._1_7_ = 0;
  BlendState::BlendState
            ((BlendState *)local_2f8,(Maybe<bool> *)local_228,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_208,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_360,(Maybe<tcu::Vector<bool,_4>_> *)&local_d0);
  if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)local_208._0_8_ !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    *(bool *)local_208._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
      *)(local_208._0_8_ + 8))->m_first = (BlendFunc *)0x0;
  }
  local_d0.m_isFirst = false;
  local_d0._1_7_ = 0;
  local_228._8_8_ = (long)local_228 + 0x10;
  local_228[0] = 1;
  local_228._16_4_ = 0x929e;
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe((Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
           *)&local_388,
          (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
          local_228);
  local_208._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_b8.m_ptr = (Vector<bool,_4> *)0x0;
  BlendState::BlendState
            ((BlendState *)local_360,(Maybe<bool> *)&local_d0,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)&local_388,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_208,&local_b8);
  if (local_388.m_ptr !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    (local_388.m_ptr)->m_isFirst = true;
    ((local_388.m_ptr)->field_1).m_first = (BlendFunc *)0x0;
  }
  local_b8.m_ptr = (Vector<bool,_4> *)0x0;
  local_d0.field_1.m_first = (uint *)&local_d0.field_2;
  local_d0.m_isFirst = true;
  local_d0.field_2.m_align._0_4_ = 0x9295;
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe((Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
           *)local_228,&local_d0);
  local_388.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_a8.m_ptr = (Vector<bool,_4> *)0x0;
  BlendState::BlendState
            ((BlendState *)local_208,(Maybe<bool> *)&local_b8,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_228,&local_388,&local_a8);
  if ((Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
      local_228._0_8_ !=
      (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0)
  {
    *(bool *)local_228._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_3
      *)(local_228._0_8_ + 8))->m_first = (uint *)0x0;
  }
  pTVar2 = createDiffTest(root->m_context,prepost,"common_blend_eq_buffer_blend_eq",&local_138,
                          (BlendState *)local_290);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pTVar2 = createDiffTest(root->m_context,prepost,"common_blend_eq_buffer_separate_blend_eq",
                          &local_138,(BlendState *)local_2f8);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pTVar2 = createAdvancedEqDiffTest
                     (root->m_context,prepost,"common_blend_eq_buffer_advanced_blend_eq",&local_138,
                      (BlendState *)local_208);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pTVar2 = createDiffTest(root->m_context,prepost,"common_separate_blend_eq_buffer_blend_eq",
                          (BlendState *)local_1a0,(BlendState *)local_290);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pTVar2 = createDiffTest(root->m_context,prepost,
                          "common_separate_blend_eq_buffer_separate_blend_eq",
                          (BlendState *)local_1a0,(BlendState *)local_2f8);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pTVar2 = createAdvancedEqDiffTest
                     (root->m_context,prepost,"common_separate_blend_eq_buffer_advanced_blend_eq",
                      (BlendState *)local_1a0,(BlendState *)local_208);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pTVar2 = createAdvancedEqDiffTest
                     (root->m_context,prepost,"common_advanced_blend_eq_buffer_blend_eq",
                      (BlendState *)local_360,(BlendState *)local_290);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pTVar2 = createAdvancedEqDiffTest
                     (root->m_context,prepost,"common_advanced_blend_eq_buffer_separate_blend_eq",
                      (BlendState *)local_360,(BlendState *)local_2f8);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pTVar2 = createAdvancedEqDiffTest
                     (root->m_context,prepost,"common_advanced_blend_eq_buffer_advanced_blend_eq",
                      (BlendState *)local_360,(BlendState *)local_208);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  BlendState::~BlendState((BlendState *)local_208);
  BlendState::~BlendState((BlendState *)local_360);
  BlendState::~BlendState((BlendState *)local_2f8);
  BlendState::~BlendState((BlendState *)local_1a0);
  BlendState::~BlendState((BlendState *)local_290);
  BlendState::~BlendState(&local_138);
  local_360._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_1a0._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_2f8[0] = 1;
  local_2e8[0] = 0x302;
  local_2e8[1] = 0x304;
  local_2f8._8_8_ = local_2e8;
  local_290._0_8_ = local_290 + 8;
  local_290[8] = '\x01';
  local_290._16_8_ = local_278;
  local_278[0]._0_8_ = 0x30400000302;
  local_208._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  BlendState::BlendState
            (&local_138,(Maybe<bool> *)local_360,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_1a0,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_290,(Maybe<tcu::Vector<bool,_4>_> *)local_208);
  uVar1 = local_290._0_8_;
  if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)local_290._0_8_ !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    *(bool *)local_290._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
      *)(uVar1 + 8))->m_first = (BlendFunc *)0x0;
  }
  local_208._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_2f8._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_360[0] = 1;
  local_350[0] = 0x304;
  local_350[1] = 0x302;
  local_360._8_8_ = local_350;
  local_1a0._0_8_ = local_1a0 + 8;
  local_1a0[8] = '\x01';
  local_1a0._16_8_ = local_188;
  local_188[0]._0_8_ = 0x30200000304;
  local_388.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  BlendState::BlendState
            ((BlendState *)local_290,(Maybe<bool> *)local_208,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_2f8,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_1a0,(Maybe<tcu::Vector<bool,_4>_> *)&local_388);
  uVar1 = local_1a0._0_8_;
  if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)local_1a0._0_8_ !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    *(bool *)local_1a0._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
      *)(uVar1 + 8))->m_first = (BlendFunc *)0x0;
  }
  local_388.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_360._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_208._0_8_ = local_208._0_8_ & 0xffffffffffffff00;
  local_1f8 = (undefined1  [8])0x30400000302;
  local_1f0[0]._0_8_ = 0x30500000303;
  local_208._8_8_ = local_1f8;
  local_2e8 = (undefined4  [2])local_2e0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2e0[0]._0_8_ = 0x30400000302;
  local_2e0[0]._8_8_ = 0x30500000303;
  local_228._0_8_ =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0
  ;
  local_2f8._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)(local_2f8 + 8);
  BlendState::BlendState
            ((BlendState *)local_1a0,(Maybe<bool> *)&local_388,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_360,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_2f8,(Maybe<tcu::Vector<bool,_4>_> *)local_228);
  uVar1 = local_2f8._0_8_;
  local_388.field_1.m_align = (long)&local_388.field_1 + 8;
  if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)local_2f8._0_8_ !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    *(bool *)local_2f8._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
      *)(uVar1 + 8))->m_first = (BlendFunc *)0x0;
  }
  local_228._0_8_ =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0
  ;
  local_208._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_388.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)((ulong)local_388.m_ptr & 0xffffffffffffff00);
  local_388.field_1._8_8_ = 0x30200000304;
  local_388.field_1._16_8_ = 0x30300000305;
  local_350 = (undefined4  [2])local_348;
  local_360._8_8_ = local_360._8_8_ & 0xffffffffffffff00;
  local_348[0]._0_8_ = 0x30200000304;
  local_348[0]._8_8_ = 0x30300000305;
  local_d0.m_isFirst = false;
  local_d0._1_7_ = 0;
  local_360._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)(local_360 + 8);
  BlendState::BlendState
            ((BlendState *)local_2f8,(Maybe<bool> *)local_228,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_208,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_360,(Maybe<tcu::Vector<bool,_4>_> *)&local_d0);
  uVar1 = local_360._0_8_;
  if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)local_360._0_8_ !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    *(bool *)local_360._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
      *)(uVar1 + 8))->m_first = (BlendFunc *)0x0;
  }
  pTVar2 = createDiffTest(root->m_context,prepost,"common_blend_func_buffer_blend_func",&local_138,
                          (BlendState *)local_290);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pTVar2 = createDiffTest(root->m_context,prepost,"common_blend_func_buffer_separate_blend_func",
                          &local_138,(BlendState *)local_2f8);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pTVar2 = createDiffTest(root->m_context,prepost,"common_separate_blend_func_buffer_blend_func",
                          (BlendState *)local_1a0,(BlendState *)local_290);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pTVar2 = createDiffTest(root->m_context,prepost,
                          "common_separate_blend_func_buffer_separate_blend_func",
                          (BlendState *)local_1a0,(BlendState *)local_2f8);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  BlendState::~BlendState((BlendState *)local_2f8);
  BlendState::~BlendState((BlendState *)local_1a0);
  BlendState::~BlendState((BlendState *)local_290);
  BlendState::~BlendState(&local_138);
  local_2f8._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_1a0._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_290._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_208._0_4_ = 0x10001;
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)local_360,(Vector<bool,_4> *)local_208);
  BlendState::BlendState
            (&local_138,(Maybe<bool> *)local_2f8,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_1a0,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_290,(Maybe<tcu::Vector<bool,_4>_> *)local_360);
  local_360._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_2f8._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_1a0._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_388.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)CONCAT44(local_388.m_ptr._4_4_,0x1000100);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)local_208,(Vector<bool,_4> *)&local_388);
  BlendState::BlendState
            ((BlendState *)local_290,(Maybe<bool> *)local_360,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_2f8,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_1a0,(Maybe<tcu::Vector<bool,_4>_> *)local_208);
  pTVar2 = createDiffTest(root->m_context,prepost,"common_color_mask_buffer_color_mask",&local_138,
                          (BlendState *)local_290);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  BlendState::~BlendState((BlendState *)local_290);
  BlendState::~BlendState(&local_138);
  BlendState::~BlendState(&local_98);
  return;
}

Assistant:

void addDrawBufferCommonTests (TestCaseGroup* root, PrePost prepost)
{
	const BlendState		emptyState	= BlendState(Maybe<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());

	{
		const BlendState	disableState	= BlendState(just(false), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());
		const BlendState	enableState		= BlendState(just(true), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());

		root->addChild(createDiffTest(root->getContext(), prepost, "common_enable_buffer_enable",	enableState,	enableState));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_disable_buffer_disable",	disableState,	disableState));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_disable_buffer_enable",	disableState,	enableState));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_enable_buffer_disable",	enableState,	disableState));
	}

	{
		const BlendState	eqStateA			= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(GL_FUNC_ADD), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());
		const BlendState	eqStateB			= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(GL_FUNC_SUBTRACT), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());

		const BlendState	separateEqStateA	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(SeparateBlendEq(GL_FUNC_ADD, GL_FUNC_SUBTRACT)), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());
		const BlendState	separateEqStateB	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(SeparateBlendEq(GL_FUNC_SUBTRACT, GL_FUNC_ADD)), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());

		const BlendState	advancedEqStateA	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(GL_DIFFERENCE), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());
		const BlendState	advancedEqStateB	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(GL_SCREEN), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());

		root->addChild(createDiffTest(root->getContext(), prepost, "common_blend_eq_buffer_blend_eq", eqStateA, eqStateB));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_blend_eq_buffer_separate_blend_eq", eqStateA, separateEqStateB));
		root->addChild(createAdvancedEqDiffTest(root->getContext(), prepost, "common_blend_eq_buffer_advanced_blend_eq", eqStateA, advancedEqStateB));

		root->addChild(createDiffTest(root->getContext(), prepost, "common_separate_blend_eq_buffer_blend_eq", separateEqStateA, eqStateB));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_separate_blend_eq_buffer_separate_blend_eq", separateEqStateA, separateEqStateB));
		root->addChild(createAdvancedEqDiffTest(root->getContext(), prepost, "common_separate_blend_eq_buffer_advanced_blend_eq", separateEqStateA, advancedEqStateB));

		root->addChild(createAdvancedEqDiffTest(root->getContext(), prepost, "common_advanced_blend_eq_buffer_blend_eq", advancedEqStateA, eqStateB));
		root->addChild(createAdvancedEqDiffTest(root->getContext(), prepost, "common_advanced_blend_eq_buffer_separate_blend_eq", advancedEqStateA, separateEqStateB));
		root->addChild(createAdvancedEqDiffTest(root->getContext(), prepost, "common_advanced_blend_eq_buffer_advanced_blend_eq", advancedEqStateA, advancedEqStateB));
	}

	{
		const BlendState	funcStateA			= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(BlendFunc(GL_SRC_ALPHA, GL_DST_ALPHA)), Maybe<BVec4>());
		const BlendState	funcStateB			= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(BlendFunc(GL_DST_ALPHA, GL_SRC_ALPHA)), Maybe<BVec4>());
		const BlendState	separateFuncStateA	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(SeparateBlendFunc(BlendFunc(GL_SRC_ALPHA, GL_DST_ALPHA), BlendFunc(GL_ONE_MINUS_SRC_ALPHA, GL_ONE_MINUS_DST_ALPHA))), Maybe<BVec4>());
		const BlendState	separateFuncStateB	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(SeparateBlendFunc(BlendFunc(GL_DST_ALPHA, GL_SRC_ALPHA), BlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_ONE_MINUS_SRC_ALPHA))), Maybe<BVec4>());

		root->addChild(createDiffTest(root->getContext(), prepost, "common_blend_func_buffer_blend_func",					funcStateA,			funcStateB));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_blend_func_buffer_separate_blend_func",			funcStateA,			separateFuncStateB));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_separate_blend_func_buffer_blend_func",			separateFuncStateA,	funcStateB));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_separate_blend_func_buffer_separate_blend_func",	separateFuncStateA,	separateFuncStateB));
	}

	{
		const BlendState	commonColorMaskState	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>(BVec4(true, false, true, false)));
		const BlendState	bufferColorMaskState	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>(BVec4(false, true, false, true)));

		root->addChild(createDiffTest(root->getContext(), prepost, "common_color_mask_buffer_color_mask", commonColorMaskState, bufferColorMaskState));
	}
}